

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<kj::Array<char>_>::dispose(ArrayBuilder<kj::Array<char>_> *this)

{
  Array<char> *pAVar1;
  RemoveConst<kj::Array<char>_> *pRVar2;
  Array<char> *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Array<char> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (Array<char> *)0x0;
    this->pos = (RemoveConst<kj::Array<char>_> *)0x0;
    this->endPtr = (Array<char> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x18,((long)pRVar2 - (long)pAVar1) / 0x18,
               ((long)pAVar3 - (long)pAVar1) / 0x18,
               ArrayDisposer::Dispose_<kj::Array<char>_>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }